

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSampleConsensusProblem.hpp
# Opt level: O1

void __thiscall
opengv::sac::MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::
MultiSampleConsensusProblem
          (MultiSampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,bool randomSeed)

{
  mt19937 *__src;
  param_type pVar1;
  long lVar2;
  param_type *ppVar3;
  function<int_()> *__p;
  ulong uVar4;
  
  this->_vptr_MultiSampleConsensusProblem = (_func_int **)&PTR__MultiSampleConsensusProblem_0020e830
  ;
  this->max_sample_checks_ = 10;
  __src = &this->rng_alg_;
  (this->indices_).
  super___shared_ptr<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->indices_).
  super___shared_ptr<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->shuffled_indices_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shuffled_indices_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shuffled_indices_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rng_alg_)._M_x[0] = 0x1571;
  uVar4 = 0x1571;
  lVar2 = 8;
  do {
    uVar4 = (ulong)((int)lVar2 + -7 + ((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965);
    (this->rng_alg_)._M_x[lVar2 + -7] = uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x277);
  (this->rng_alg_)._M_p = 0x270;
  this->rng_dist_ = (shared_ptr<std::uniform_int_distribution<int>_>)SUB3216(ZEXT432(0) << 0x40,0);
  this->rng_gen_ = (shared_ptr<std::function<int_()>_>)SUB3216(ZEXT432(0) << 0x40,0x10);
  ppVar3 = (param_type *)operator_new(8);
  ppVar3->_M_a = 0;
  ppVar3->_M_b = 0x7fffffff;
  std::__shared_ptr<std::uniform_int_distribution<int>,(__gnu_cxx::_Lock_policy)2>::
  reset<std::uniform_int_distribution<int>>
            ((__shared_ptr<std::uniform_int_distribution<int>,(__gnu_cxx::_Lock_policy)2> *)
             &this->rng_dist_,(uniform_int_distribution<int> *)ppVar3);
  if (randomSeed) {
    uVar4 = time((time_t *)0x0);
    uVar4 = uVar4 & 0xffffffff;
    __src->_M_x[0] = uVar4;
    lVar2 = 8;
    do {
      uVar4 = (ulong)((int)lVar2 + -7 + ((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965);
      (this->rng_alg_)._M_x[lVar2 + -7] = uVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x277);
  }
  else {
    __src->_M_x[0] = 0x3039;
    uVar4 = 0x3039;
    lVar2 = 8;
    do {
      uVar4 = (ulong)((int)lVar2 + -7 + ((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965);
      (this->rng_alg_)._M_x[lVar2 + -7] = uVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x277);
  }
  (this->rng_alg_)._M_p = 0x270;
  __p = (function<int_()> *)operator_new(0x20);
  pVar1 = ((this->rng_dist_).
           super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_M_param;
  *(undefined8 *)&(__p->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__p->super__Function_base)._M_functor + 8) = 0;
  (__p->super__Function_base)._M_manager = (_Manager_type)0x0;
  __p->_M_invoker = (_Invoker_type)0x0;
  ppVar3 = (param_type *)operator_new(0x1390);
  *ppVar3 = pVar1;
  memcpy(ppVar3 + 1,__src,5000);
  *(param_type **)&(__p->super__Function_base)._M_functor = ppVar3;
  __p->_M_invoker =
       std::
       _Function_handler<int_(),_std::_Bind<std::uniform_int_distribution<int>_(std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>)>_>
       ::_M_invoke;
  (__p->super__Function_base)._M_manager =
       std::
       _Function_handler<int_(),_std::_Bind<std::uniform_int_distribution<int>_(std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>)>_>
       ::_M_manager;
  std::__shared_ptr<std::function<int()>,(__gnu_cxx::_Lock_policy)2>::reset<std::function<int()>>
            ((__shared_ptr<std::function<int()>,(__gnu_cxx::_Lock_policy)2> *)&this->rng_gen_,__p);
  return;
}

Assistant:

opengv::sac::MultiSampleConsensusProblem<M>::MultiSampleConsensusProblem(
    bool randomSeed) :
    max_sample_checks_(10)
{
  rng_dist_.reset(new std::uniform_int_distribution<>( 0, std::numeric_limits<int>::max () ));
  // Create a random number generator object
  if (randomSeed)
    rng_alg_.seed(static_cast<unsigned> (std::time(0)));
  else
    rng_alg_.seed(12345u);

  rng_gen_.reset(new std::function<int()>(std::bind(*rng_dist_, rng_alg_)));
}